

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestPipelineImpl::getCap(TestPipelineImpl *this,GetCapContext context)

{
  uint32_t uVar1;
  char *__n;
  TestPipelineImpl *in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  int __flags;
  char *in_R8;
  Promise<void> PVar2;
  CallContextHook *local_120;
  TestPipelineImpl *local_118;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_110;
  Maybe<capnp::MessageSize> local_d8;
  undefined1 local_c0 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  undefined1 local_78 [8];
  Client cap;
  int local_58;
  bool local_51;
  undefined1 local_50 [7];
  bool _kj_shouldLog;
  Reader params;
  TestPipelineImpl *this_local;
  GetCapContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  params._reader._40_8_ = context.hook;
  this_local = in_RDX;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::getParams((Reader *)local_50,
              (CallContext<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
               *)&this_local);
  uVar1 = capnproto_test::capnp::test::TestPipeline::GetCapParams::Reader::getN((Reader *)local_50);
  __flags = (int)in_R8;
  __n = (char *)(ulong)uVar1;
  if (uVar1 != 0xea) {
    local_51 = kj::_::Debug::shouldLog(ERROR);
    while (__flags = (int)in_R8, local_51 != false) {
      local_58 = 0xea;
      cap._20_4_ = capnproto_test::capnp::test::TestPipeline::GetCapParams::Reader::getN
                             ((Reader *)local_50);
      __n = "\"failed: expected \" \"(234) == (params.getN())\", 234, params.getN()";
      in_R8 = "failed: expected (234) == (params.getN())";
      kj::_::Debug::log<char_const(&)[42],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x3a8,ERROR,
                 "\"failed: expected \" \"(234) == (params.getN())\", 234, params.getN()",
                 (char (*) [42])"failed: expected (234) == (params.getN())",&local_58,
                 (uint *)&cap.field_0x14);
      local_51 = false;
    }
  }
  capnproto_test::capnp::test::TestPipeline::GetCapParams::Reader::getInCap
            ((Client *)local_78,(Reader *)local_50);
  CallContext<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::releaseParams((CallContext<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
                   *)&this_local);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_d8,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_c0,(Client *)local_78,&local_d8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_d8);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_c0,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_c0,true);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_110,(int)local_c0,__buf,(size_t)__n,__flags);
  local_118 = this_local;
  local_120 = context.hook;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>>::
  then<capnp::_::TestPipelineImpl::getCap(capnp::CallContext<capnproto_test::capnp::test::TestPipeline::GetCapParams,capnproto_test::capnp::test::TestPipeline::GetCapResults>)::__0,kj::_::PropagateException>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>> *)
             this,(Type *)&local_110,(PropagateException *)&local_120);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_110);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_c0);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_78);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestPipelineImpl::getCap(GetCapContext context) {
  ++callCount;

  auto params = context.getParams();
  EXPECT_EQ(234, params.getN());

  auto cap = params.getInCap();
  context.releaseParams();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  return request.send().then(
      [this,KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());

        auto result = context.getResults();
        result.setS("bar");
        result.initOutBox().setCap(kj::heap<TestExtendsImpl>(callCount));
      }